

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O0

ostream * Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                    (ostream *stream,AffineMatrix4T<float> *mat)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  float *pfVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  ostream *poVar7;
  char local_131;
  char local_109;
  char local_d1;
  allocator local_c1;
  string local_c0 [32];
  ulong local_a0;
  size_t c_2;
  allocator local_81;
  string local_80 [32];
  ulong local_60;
  size_t c_1;
  size_t r_1;
  ulong local_48;
  size_t r;
  size_t c;
  size_t lengths [4];
  AffineMatrix4T<float> *mat_local;
  ostream *stream_local;
  
  lengths[3] = (size_t)mat;
  for (r = 0; r < 4; r = r + 1) {
    lengths[r - 1] = 0;
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      lVar3 = r - 1;
      pfVar4 = AffineMatrix4T<float>::operator()((AffineMatrix4T<float> *)lengths[3],local_48,r);
      r_1 = Length<float>(pfVar4);
      puVar5 = std::max<unsigned_long>(lengths + lVar3,&r_1);
      lengths[r - 1] = *puVar5;
    }
  }
  for (c_1 = 0; c_1 < 3; c_1 = c_1 + 1) {
    local_d1 = '/';
    if (c_1 != 0) {
      local_d1 = '|';
    }
    std::operator<<(stream,local_d1);
    for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
      sVar1 = lengths[local_60 - 1];
      pfVar4 = AffineMatrix4T<float>::operator()((AffineMatrix4T<float> *)lengths[3],c_1,local_60);
      sVar6 = Length<float>(pfVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,(sVar1 - sVar6) + 1,' ',&local_81);
      std::operator<<(stream,local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      pfVar4 = AffineMatrix4T<float>::operator()((AffineMatrix4T<float> *)lengths[3],c_1,local_60);
      poVar7 = (ostream *)std::ostream::operator<<(stream,*pfVar4);
      std::operator<<(poVar7,' ');
    }
    local_109 = '\\';
    if (c_1 != 0) {
      local_109 = '|';
    }
    poVar7 = std::operator<<(stream,local_109);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<(stream,'\\');
  for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
    uVar2 = lengths[local_a0 - 1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,uVar2,' ',&local_c1);
    std::operator<<(stream,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    local_131 = '1';
    if (local_a0 != 3) {
      local_131 = '0';
    }
    poVar7 = std::operator<<(stream,local_131);
    std::operator<<(poVar7,' ');
  }
  poVar7 = std::operator<<(stream,'/');
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  return stream;
}

Assistant:

std::ostream& ShiftAffineMatrixOStream(std::ostream& stream, const M& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[M::columnsSparse];

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < M::rowsSparse; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    #if GS_ROW_VECTORS

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == M::rowsSparse ? '\\' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        /* Write implicit column */
        stream << ' ' << (r + 1 == M::rowsSparse ? '1' : '0');
        stream << ' ' << (r == 0 ? '\\' : r + 1 == M::rowsSparse ? '/' : '|')  << std::endl;
    }

    #else

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : '|')  << std::endl;
    }

    /* Write implicit row */
    stream << '\\';

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        stream << std::string(lengths[c], ' ');
        stream << (c + 1 == M::columnsSparse ? '1' : '0') << ' ';
    }

    stream << '/' << std::endl;

    #endif

    return stream;
}